

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmCustomCommandLines *this_00;
  pointer puVar1;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var2;
  cmake *this_01;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  string *psVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  cmValue cVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GlobalTargetInfo *this_02;
  string_view sep;
  allocator<char> local_2b9;
  string cfgArg;
  allocator<char> local_291;
  cmValue noall;
  cmCustomCommandLine singleLine;
  string cmd;
  _Alloc_hider local_228;
  _Map_pointer local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Elt_pointer local_208;
  pointer pcStack_200;
  pointer local_1f8;
  pointer pbStack_1f0;
  _Base_ptr local_1e8;
  _Base_ptr p_Stack_1e0;
  _Alloc_hider local_1d8;
  size_t local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  bool local_1b8;
  PerConfig local_1b4;
  bool local_1b0;
  GlobalTargetInfo gti;
  char *pcVar5;
  
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x17])();
  pcVar5 = (char *)CONCAT44(extraout_var,iVar4);
  _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gti,"CMAKE_SKIP_INSTALL_RULES",(allocator<char> *)&cmd);
  bVar3 = cmMakefile::IsOn((cmMakefile *)
                           _Var2._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&gti.Name);
  std::__cxx11::string::~string((string *)&gti);
  if ((bVar3 & this->InstallTargetEnabled) == 1) {
    this_01 = this->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gti,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,(allocator<char> *)&cfgArg);
    cmMakefile::GetBacktrace((cmMakefile *)&cmd);
    cmake::IssueMessage(this_01,WARNING,&gti.Name,(cmListFileBacktrace *)&cmd);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cmd._M_string_length);
    this_02 = &gti;
  }
  else {
    if (bVar3 || this->InstallTargetEnabled != true) {
      return;
    }
    if (((pcVar5 == (char *)0x0) || (*pcVar5 == '.')) || (*pcVar5 == '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&gti);
      if ((this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::operator<<((ostream *)&gti,"Only default component available");
      }
      else {
        std::operator<<((ostream *)&gti,"Available install components are: ");
        sep._M_str = " ";
        sep._M_len = 1;
        cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  (&cmd,'\"',&this->InstallComponents,'\"',sep);
        std::operator<<((ostream *)&gti,(string *)&cmd);
        std::__cxx11::string::~string((string *)&cmd);
      }
      cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
      cmd._M_string_length = 0;
      cmd.field_2._M_local_buf[0] = '\0';
      local_228._M_p = (pointer)&local_218;
      local_220 = (_Map_pointer)0x0;
      local_218._M_local_buf[0] = '\0';
      local_1d8._M_p = (pointer)&local_1c8;
      local_208 = (_Elt_pointer)0x0;
      pcStack_200 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      pbStack_1f0 = (pointer)0x0;
      local_1e8 = (_Base_ptr)0x0;
      p_Stack_1e0 = (_Base_ptr)0x0;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_1b8 = false;
      local_1b4 = Yes;
      local_1b0 = false;
      std::__cxx11::string::assign((char *)&cmd);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_228,(string *)&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
      local_1b8 = false;
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,(GlobalTargetInfo *)&cmd);
      GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)&cmd);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gti);
    }
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)&cmd,(string *)psVar6);
    gti.Name._M_dataplus._M_p = (pointer)&gti.Name.field_2;
    gti.Name._M_string_length = 0;
    gti.Name.field_2._M_local_buf[0] = '\0';
    gti.Message._M_dataplus._M_p = (pointer)&gti.Message.field_2;
    gti.Message._M_string_length = 0;
    gti.Message.field_2._M_local_buf[0] = '\0';
    gti.WorkingDir._M_dataplus._M_p = (pointer)&gti.WorkingDir.field_2;
    gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    gti.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gti.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gti.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gti.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gti.WorkingDir._M_string_length = 0;
    gti.WorkingDir.field_2._M_local_buf[0] = '\0';
    gti.UsesTerminal = false;
    gti.PerConfig = Yes;
    gti.StdPipesUTF8 = false;
    (*this->_vptr_cmGlobalGenerator[0x1c])(this);
    std::__cxx11::string::assign((char *)&gti);
    psVar6 = &gti.Message;
    std::__cxx11::string::assign((char *)psVar6);
    gti.UsesTerminal = true;
    gti.StdPipesUTF8 = true;
    singleLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    singleLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    singleLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
    if (CONCAT44(extraout_var_00,iVar4) == 0) {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cfgArg,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",&local_2b9);
      noall = cmMakefile::GetDefinition
                        ((cmMakefile *)
                         _Var2._M_t.
                         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
      bVar3 = cmValue::IsOff(&noall);
      if (bVar3) {
        iVar4 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
        cfgArg._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gti.Depends
                   ,(char **)&cfgArg);
      }
    }
    else {
      iVar4 = (*this->_vptr_cmGlobalGenerator[0x1f])(this);
      cfgArg._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gti.Depends,
                 (char **)&cfgArg);
    }
    _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cfgArg,"CMake_BINARY_DIR",&local_2b9);
    cVar7 = cmMakefile::GetDefinition
                      ((cmMakefile *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&cfgArg);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::~string((string *)&cfgArg);
    }
    else {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&noall,"CMAKE_CROSSCOMPILING",&local_291);
      bVar3 = cmMakefile::IsOn((cmMakefile *)
                               _Var2._M_t.
                               super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                               .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                               (string *)&noall);
      std::__cxx11::string::~string((string *)&noall);
      std::__cxx11::string::~string((string *)&cfgArg);
      if (!bVar3) {
        std::__cxx11::string::assign((char *)&cmd);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&cmd);
    if (((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) && (*pcVar5 != '.')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cfgArg,"-DBUILD_TYPE=",(allocator<char> *)&noall);
      iVar4 = (*this->_vptr_cmGlobalGenerator[0x31])
                        (this,(_Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>)
                              (puVar1->_M_t).
                              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                              _M_t);
      if ((char)iVar4 == '\0') {
        (*this->_vptr_cmGlobalGenerator[0x17])(this);
        std::__cxx11::string::append((char *)&cfgArg);
      }
      else {
        std::__cxx11::string::append((char *)&cfgArg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,&cfgArg);
        std::__cxx11::string::assign((char *)&cfgArg);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cfgArg,"-P",(allocator<char> *)&noall);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    std::__cxx11::string::~string((string *)&cfgArg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cfgArg,"cmake_install.cmake",(allocator<char> *)&noall);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    this_00 = &gti.CommandLines;
    std::__cxx11::string::~string((string *)&cfgArg);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               &singleLine);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,&gti);
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x1d])(this);
    if (CONCAT44(extraout_var_03,iVar4) != 0) {
      std::__cxx11::string::assign((char *)&gti);
      std::__cxx11::string::assign((char *)psVar6);
      gti.UsesTerminal = true;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&noall,
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      cVar7 = noall;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cfgArg,"-DCMAKE_INSTALL_LOCAL_ONLY=1",&local_2b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&noall,cVar7.Value + 1,&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>
                (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (cmCustomCommandLine *)&noall);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(targets,&gti);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&noall);
    }
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x1e])(this);
    if (CONCAT44(extraout_var_04,iVar4) != 0) {
      _Var2._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cfgArg,"CMAKE_STRIP",(allocator<char> *)&noall);
      bVar3 = cmMakefile::IsSet((cmMakefile *)
                                _Var2._M_t.
                                super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&cfgArg);
      std::__cxx11::string::~string((string *)&cfgArg);
      if (bVar3) {
        std::__cxx11::string::assign((char *)&gti);
        std::__cxx11::string::assign((char *)psVar6);
        gti.UsesTerminal = true;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                  (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&noall,
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        cVar7 = noall;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cfgArg,"-DCMAKE_INSTALL_DO_STRIP=1",&local_2b9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&noall,cVar7.Value + 1,&cfgArg);
        std::__cxx11::string::~string((string *)&cfgArg);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&this_00->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                   ,(cmCustomCommandLine *)&noall);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back(targets,&gti);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&noall);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    GlobalTargetInfo::~GlobalTargetInfo(&gti);
    this_02 = (GlobalTargetInfo *)&cmd;
  }
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      MessageType::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!(cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.')) {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(std::move(gti));
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    gti.StdPipesUTF8 = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.emplace_back(this->GetPreinstallTargetName());
    } else {
      cmValue noall = mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (noall.IsOff()) {
        gti.Depends.emplace_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf.get());
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += this->GetCMakeCFGIntDir();
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(std::move(localCmdLine));
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != nullptr) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(std::move(stripCmdLine));
      targets.push_back(gti);
    }
  }
}